

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O0

bool __thiscall
RX::match(RX *this,vector<int,_std::allocator<int>_> *start,vector<int,_std::allocator<int>_> *end,
         string *in)

{
  int iVar1;
  long lVar2;
  size_type sVar3;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int length;
  int offset;
  regmatch_t rm [2];
  string *in_local;
  vector<int,_std::allocator<int>_> *end_local;
  vector<int,_std::allocator<int>_> *start_local;
  RX *this_local;
  
  rm[1] = (regmatch_t)in;
  if ((this->_compiled & 1U) == 0) {
    compile(this);
  }
  local_3c = 0;
  local_40 = std::__cxx11::string::length();
  while( true ) {
    lVar2 = std::__cxx11::string::c_str();
    iVar1 = regexec((regex_t *)&this->_regex,(char *)(lVar2 + local_3c),2,(regmatch_t *)&length,0);
    if (iVar1 != 0 || local_40 <= local_3c) break;
    local_44 = length + local_3c;
    std::vector<int,_std::allocator<int>_>::push_back(start,&local_44);
    local_48 = offset + local_3c;
    std::vector<int,_std::allocator<int>_>::push_back(end,&local_48);
    local_3c = offset + local_3c;
    if (length == offset) {
      local_3c = local_3c + 1;
    }
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size(start);
  return (bool)(-(sVar3 != 0) & 1);
}

Assistant:

bool RX::match (
  std::vector <int>& start,
  std::vector <int>& end,
  const std::string& in)
{
  if (!_compiled)
    compile ();

  regmatch_t rm[2];
  int offset = 0;
  int length = in.length ();
  while (regexec (&_regex, in.c_str () + offset, 2, &rm[0], 0) == 0 &&
         offset < length)
  {
    start.push_back (rm[0].rm_so + offset);
    end.push_back   (rm[0].rm_eo + offset);
    offset += rm[0].rm_eo;

    // Protection against zero-width patterns causing infinite loops.
    if (rm[0].rm_so == rm[0].rm_eo)
      ++offset;
  }

  return start.size () ? true : false;
}